

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O2

void __thiscall front::syntax::SyntaxAnalyze::gm_block_item(SyntaxAnalyze *this)

{
  bool bVar1;
  
  bVar1 = try_word(this,1,CONSTTK);
  if (bVar1) {
    gm_const_decl(this);
    return;
  }
  bVar1 = try_word(this,1,INTTK);
  if (bVar1) {
    gm_var_decl(this);
    return;
  }
  gm_stmt(this);
  return;
}

Assistant:

void SyntaxAnalyze::gm_block_item() {
  if (try_word(1, Token::CONSTTK)) {
    gm_const_decl();
  } else if (try_word(1, Token::INTTK)) {
    gm_var_decl();
  } else {
    gm_stmt();
  }
}